

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

OASIS_FLOAT ** __thiscall
summarycalc::alloc_ssl_arrays(summarycalc *this,int summary_set,int sample_size)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  OASIS_FLOAT **ppOVar5;
  OASIS_FLOAT *pOVar6;
  int local_2c;
  int i;
  OASIS_FLOAT **ssl;
  int maxsummaryids;
  int sample_size_local;
  int summary_set_local;
  summarycalc *this_local;
  
  if (this->min_summary_id_[summary_set] != 1) {
    fprintf(_stderr,"FATAL: summarycalc: Minimum summary ID is not equal to one\n");
    exit(-1);
  }
  iVar1 = this->max_summary_id_[summary_set];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(iVar1 + 1);
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  ppOVar5 = (OASIS_FLOAT **)operator_new__(uVar4);
  for (local_2c = 0; local_2c <= iVar1; local_2c = local_2c + 1) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(sample_size + this->num_idx_ + 1);
    uVar4 = SUB168(auVar3 * ZEXT816(4),0);
    if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pOVar6 = (OASIS_FLOAT *)operator_new__(uVar4);
    ppOVar5[local_2c] = pOVar6;
  }
  return ppOVar5;
}

Assistant:

OASIS_FLOAT **summarycalc::alloc_ssl_arrays(int summary_set, int sample_size)
{
	if (min_summary_id_[summary_set] != 1) {
		fprintf(stderr, "FATAL: summarycalc: Minimum summary ID is not equal to one\n");
		exit(-1);
	}
	int maxsummaryids = max_summary_id_[summary_set] ;
	OASIS_FLOAT **ssl = new OASIS_FLOAT*[maxsummaryids + 1];
	for (int i = 0; i <= maxsummaryids; i++){
		ssl[i] = new OASIS_FLOAT[sample_size + num_idx_ + 1];   // allocate for -5, -4, -3, -2, -1, 0 as well as samplesize
	}
	return ssl;
}